

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_source.hpp
# Opt level: O0

void __thiscall
ItemSourceShop::ItemSourceShop
          (ItemSourceShop *this,string *name,vector<Entity_*,_std::allocator<Entity_*>_> *entities,
          uint8_t shop_item_id,string *node_id,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *hints)

{
  allocator<char> local_81;
  string local_80;
  vector<Entity_*,_std::allocator<Entity_*>_> local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *hints_local;
  string *node_id_local;
  vector<Entity_*,_std::allocator<Entity_*>_> *pvStack_20;
  uint8_t shop_item_id_local;
  vector<Entity_*,_std::allocator<Entity_*>_> *entities_local;
  string *name_local;
  ItemSourceShop *this_local;
  
  local_38 = hints;
  hints_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)node_id;
  node_id_local._7_1_ = shop_item_id;
  pvStack_20 = entities;
  entities_local = (vector<Entity_*,_std::allocator<Entity_*>_> *)name;
  name_local = (string *)this;
  std::vector<Entity_*,_std::allocator<Entity_*>_>::vector(&local_50,entities);
  ItemSourceOnGround::ItemSourceOnGround
            (&this->super_ItemSourceOnGround,name,&local_50,node_id_local._7_1_,
             (string *)hints_local,local_38,false);
  std::vector<Entity_*,_std::allocator<Entity_*>_>::~vector(&local_50);
  (this->super_ItemSourceOnGround).super_ItemSource._vptr_ItemSource =
       (_func_int **)&PTR__ItemSourceShop_003c76a8;
  *(undefined2 *)&(this->super_ItemSourceOnGround).field_0x82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"owned by someone trying to make profit out of it",&local_81);
  ItemSource::add_hint((ItemSource *)this,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

ItemSourceShop(const std::string& name, std::vector<Entity*> entities, uint8_t shop_item_id, const std::string& node_id = "",
                    const std::vector<std::string>& hints = {}) :
        ItemSourceOnGround (name, std::move(entities), shop_item_id, node_id, hints, false)
    {
        this->add_hint("owned by someone trying to make profit out of it");
    }